

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * xname2(obj *obj,boolean ignore_oquan)

{
  objclass *poVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  char cVar5;
  objclass *poVar6;
  boolean bVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  char *__s;
  Jitem *pJVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  fruit *__src;
  byte bVar24;
  byte bVar25;
  fruit *__src_00;
  fruit *pfVar26;
  bool bVar27;
  
  sVar3 = urole.malenum;
  poVar6 = objects;
  cVar5 = (char)program_state.gameover;
  uVar2 = obj->otyp;
  uVar22 = (ulong)(short)uVar2;
  poVar1 = objects + uVar22;
  bVar27 = true;
  if ((((poVar1->field_0x10 & 1) == 0) &&
      (bVar27 = false, (*(uint *)&obj->field_0x4a >> 0xd & 1) != 0)) && (2 < (ushort)(uVar2 - 0xda))
     ) {
    bVar27 = true;
    if ((viz_array[obj->oy][obj->ox] & 2U) == 0) {
      if (u.ux == obj->ox) {
        bVar27 = u.uy == obj->oy;
      }
      else {
        bVar27 = false;
      }
    }
  }
  __src = (fruit *)obj_descr[poVar1->oc_name_idx].oc_name;
  __src_00 = (fruit *)obj_descr[poVar1->oc_descr_idx].oc_descr;
  pcVar14 = poVar1->oc_uname;
  uVar4 = *(uint *)&obj->field_0x4a;
  bVar24 = (byte)uVar4;
  iVar8 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar8) >> 1) - iVar8) * -0xc + 1;
  lVar9 = (long)nextobuf_bufidx * 0x100;
  __s = nextobuf_bufs + lVar9 + 0x50;
  uVar21 = (uint)(short)uVar2;
  if (urole.malenum == 0x165) {
    uVar17 = 0x1d;
    pJVar15 = Japanese_items;
    do {
      pJVar15 = pJVar15 + 1;
      if (uVar17 == uVar21) {
        if (pJVar15[-1].name != (char *)0x0) {
          uVar17 = 0x1d;
          pJVar15 = Japanese_items;
          __src = (fruit *)0x0;
          goto LAB_001ff1c1;
        }
        break;
      }
      uVar17 = pJVar15->item;
    } while (uVar17 != 0);
  }
  goto LAB_001ff1d5;
  while( true ) {
    uVar17 = pJVar15->item;
    if (uVar17 == 0) break;
LAB_001ff1c1:
    pJVar15 = pJVar15 + 1;
    if (uVar17 == uVar21) {
      __src = (fruit *)pJVar15[-1].name;
      break;
    }
  }
LAB_001ff1d5:
  bVar25 = bVar24 >> 4 & 1;
  *__s = '\0';
  if ((bVar27 == false) && ((~poVar1->field_0x10 & 0x44) == 0)) {
    bVar25 = 0;
  }
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((bVar24 = bVar24 >> 5 & 1, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    bVar24 = 1;
  }
  bVar16 = bVar24;
  if (((obj->field_0x4b & 0x20) != 0) && (bVar16 = 1, (ushort)(obj->otyp - 0xdaU) < 3)) {
    bVar16 = bVar24;
  }
  bVar7 = obj_is_pname(obj);
  if (bVar7 != '\0') goto LAB_002002cb;
  if ((cVar5 == '\0' && (int)obj->oprops_known < 0) && ((obj->oprops & ~obj->oprops_known) != 0)) {
    sVar10 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"magical ",8);
    *(undefined1 *)(lVar9 + 0x32f838 + sVar10) = 0;
  }
  if (((((obj->field_0x4b & 0x20) != 0) && ((obj->otyp & 0xfffeU) != 0xda)) && (obj->otyp != 0xdc))
     && ((fruit *)pcVar14 == (fruit *)0x0)) {
    sVar10 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"priz",4);
    *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x20657a;
  }
  pfVar26 = (fruit *)pcVar14;
  switch(obj->oclass) {
  case '\x02':
    if (((byte)(poVar6[obj->otyp].oc_subtyp + 0x1aU) < 5) && ((obj->field_0x4b & 0x80) != 0)) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"poisoned",8);
      *(undefined2 *)(lVar9 + 0x32f838 + sVar10) = 0x20;
    }
  case '\x06':
  case '\x11':
    if (uVar21 == 0xed) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"pair of ",8);
      *(undefined1 *)(lVar9 + 0x32f838 + sVar10) = 0;
    }
    if (bVar16 == 0) {
      if (__src_00 != (fruit *)0x0) {
        __src = __src_00;
      }
      strcat(__s,__src->fname);
    }
    else {
      if (((obj->oprops & 4) != 0) &&
         (uVar22 = obj->oprops_known, (byte)((byte)(((uint)uVar22 & 4) >> 2) | cVar5 != '\0') == 1))
      {
        sVar10 = strlen(__s);
        if ((uVar22 & 4) == 0) {
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"[thirsty] ",0xb);
        }
        else {
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"thirsty ",9);
        }
      }
      if (((obj->oprops & 8) != 0) &&
         (uVar22 = obj->oprops_known, (byte)((byte)(((uint)uVar22 & 8) >> 3) | cVar5 != '\0') == 1))
      {
        sVar10 = strlen(__s);
        if ((uVar22 & 8) == 0) {
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"[vorpal] ",10);
        }
        else {
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"vorpal ",8);
        }
      }
      if (bVar27 == false) {
        if (((((fruit *)pcVar14 != (fruit *)0x0) || ((obj->field_0x4b & 0x20) == 0)) ||
            ((ushort)(obj->otyp - 0xdaU) < 3)) || (obj->oclass == '\x02')) {
          if (__src_00 != (fruit *)0x0) {
            __src = __src_00;
          }
          goto LAB_001ffce1;
        }
        sVar10 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"tool",4);
        *(undefined1 *)(lVar9 + 0x32f834 + sVar10) = 0;
      }
      else {
LAB_001ffce1:
        strcat(__s,__src->fname);
      }
      lVar13 = obj->oprops;
      lVar19 = obj->oprops_known;
      pcVar12 = __s;
      if (uVar21 == 0xed) {
        pcVar12 = strstr(__s,"pair of ");
        pcVar12 = pcVar12 + 8;
      }
      pcVar12 = strstr(pcVar12," of ");
      propnames(__s,lVar13,lVar19,'\x01',pcVar12 != (char *)0x0);
      if (bVar27 == false && (fruit *)pcVar14 != (fruit *)0x0) {
        pcVar12 = eos(__s);
        sprintf(pcVar12," called %s",pcVar14);
      }
    }
    if (uVar21 == 0xf6) {
      pcVar12 = eos(__s);
      pcVar14 = mons_mname(mons + obj->corpsenm);
      pcVar14 = strchr("aeiouAEIOU",(int)*pcVar14);
      __src_00 = (fruit *)0x2b109b;
      if (pcVar14 == (char *)0x0) {
        __src_00 = (fruit *)0x2a8997;
      }
      pcVar14 = mons_mname(mons + obj->corpsenm);
      pcVar23 = " of a%s %s";
LAB_001ffde0:
      sprintf(pcVar12,pcVar23,__src_00,pcVar14);
    }
    break;
  case '\x03':
    if ((ushort)(uVar2 - 0x5f) < 0xb) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"set of ",8);
    }
    if ((obj->oclass == '\x03') &&
       ((poVar6[obj->otyp].oc_subtyp == '\x04' || (poVar6[obj->otyp].oc_subtyp == '\x03')))) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"pair of ",8);
      *(undefined1 *)(lVar9 + 0x32f838 + sVar10) = 0;
    }
    if (((bVar16 != 0) && ((obj->oprops & 0x40) != 0)) &&
       (uVar22 = obj->oprops_known, (byte)((byte)(((uint)uVar22 & 0x40) >> 6) | cVar5 != '\0') == 1)
       ) {
      sVar10 = strlen(__s);
      if ((uVar22 & 0x40) == 0) {
        builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"[oilskin] ",0xb);
      }
      else {
        builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"oilskin ",9);
      }
    }
    sVar3 = obj->otyp;
    lVar13 = (long)sVar3;
    if (((lVar13 < 0x89) || (0x8b < sVar3)) || (bVar16 != 0)) {
      if ((sVar3 == 0x8e) && (bVar16 == 0)) {
        *(undefined8 *)(nextobuf_bufs + lVar9 + 0x56) = 0x646c6569687320;
        builtin_strncpy(nextobuf_bufs + lVar9 + 0x50,"smooth s",8);
        goto LAB_00200125;
      }
      if (bVar27 == false) {
        if (((fruit *)pcVar14 != (fruit *)0x0) ||
           (((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0 && (2 < (ushort)(sVar3 - 0xdaU))))) {
          if (obj->oclass == '\x03') {
            if (poVar6[lVar13].oc_subtyp == '\x04') {
              sVar10 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"boot",4);
              *(undefined2 *)(lVar9 + 0x32f834 + sVar10) = 0x73;
            }
            else if (poVar6[lVar13].oc_subtyp == '\x03') {
              sVar10 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"glov",4);
              *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x736576;
            }
            else if (poVar6[lVar13].oc_subtyp == '\x05') {
              sVar10 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"cloa",4);
              *(undefined2 *)(lVar9 + 0x32f834 + sVar10) = 0x6b;
            }
            else if (poVar6[lVar13].oc_subtyp == '\x02') {
              sVar10 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"helm",4);
              *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x74656d;
            }
            else {
              if (poVar6[lVar13].oc_subtyp != '\x01') goto LAB_002005e4;
              sVar10 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"shie",4);
              *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x646c65;
            }
          }
          else {
LAB_002005e4:
            sVar10 = strlen(__s);
            builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"armo",4);
            *(undefined2 *)(lVar9 + 0x32f834 + sVar10) = 0x72;
          }
          if ((fruit *)pcVar14 != (fruit *)0x0) {
            propnames(__s,obj->oprops,obj->oprops_known,'\0','\0');
            sVar10 = strlen(__s);
            builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," called ",8);
            *(undefined1 *)(lVar9 + 0x32f838 + sVar10) = 0;
            goto LAB_001ff4c4;
          }
          break;
        }
        strcat(__s,(char *)__src_00);
        lVar13 = obj->oprops;
        lVar19 = obj->oprops_known;
        if ((ushort)(uVar2 - 0x5f) < 0xb) {
          lVar20 = 7;
          pcVar12 = "set of ";
LAB_002003c4:
          pcVar14 = strstr(__s,pcVar12);
          pcVar14 = pcVar14 + lVar20;
        }
        else {
          pcVar14 = __s;
          if (obj->oclass == '\x03') {
            lVar20 = 8;
            pcVar12 = "pair of ";
            if ((poVar6[obj->otyp].oc_subtyp == '\x04') || (poVar6[obj->otyp].oc_subtyp == '\x03'))
            goto LAB_002003c4;
          }
        }
        pcVar14 = strstr(pcVar14," of ");
        propnames(__s,lVar13,lVar19,'\0',pcVar14 != (char *)0x0);
        break;
      }
      strcat(__s,__src->fname);
      lVar13 = obj->oprops;
      lVar19 = obj->oprops_known;
      pcVar14 = strstr(__src->fname," of ");
      bVar27 = pcVar14 != (char *)0x0;
    }
    else {
      *(undefined4 *)(nextobuf_bufs + lVar9 + 0x53) = 0x646c65;
      builtin_strncpy(nextobuf_bufs + lVar9 + 0x50,"shie",4);
LAB_00200125:
      lVar13 = obj->oprops;
      lVar19 = obj->oprops_known;
      bVar27 = false;
    }
    propnames(__s,lVar13,lVar19,'\0',bVar27);
    break;
  case '\x04':
    if (bVar16 == 0) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"ring",4);
LAB_001ffa07:
      *(undefined1 *)(lVar9 + 0x32f834 + sVar10) = 0;
    }
    else {
      if (bVar27 == false) {
        if (((fruit *)pcVar14 == (fruit *)0x0) &&
           (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))) {
          pcVar12 = eos(__s);
          sprintf(pcVar12,"%s ring",__src_00);
        }
        else {
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"ring",4);
          *(undefined1 *)(lVar9 + 0x32f834 + sVar10) = 0;
        }
      }
      else {
        pcVar12 = eos(__s);
        sprintf(pcVar12,"ring of %s",__src);
      }
      propnames(__s,obj->oprops,obj->oprops_known,'\0',bVar27);
      if ((fruit *)pcVar14 != (fruit *)0x0 && bVar27 == false) {
LAB_0020025f:
        pcVar12 = eos(__s);
        pcVar23 = " called %s";
        goto LAB_00200274;
      }
    }
    break;
  case '\x05':
    if (bVar16 == 0) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"amul",4);
      *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x74656c;
    }
    else {
      if ((uVar21 & 0xfffe) == 0xd8) {
        if (bVar25 == 0) {
          __src = __src_00;
        }
        strcat(__s,__src->fname);
      }
      else if (bVar27 == false) {
        if (((fruit *)pcVar14 == (fruit *)0x0) &&
           (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))) {
          pcVar12 = eos(__s);
          sprintf(pcVar12,"%s amulet",__src_00);
        }
        else {
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"amul",4);
          *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x74656c;
        }
      }
      else {
        strcat(__s,__src->fname);
      }
      lVar13 = obj->oprops;
      lVar19 = obj->oprops_known;
      pcVar12 = strstr(__s," of ");
      propnames(__s,lVar13,lVar19,'\0',pcVar12 != (char *)0x0);
      if (bVar27 == false && (fruit *)pcVar14 != (fruit *)0x0) goto LAB_0020025f;
    }
    break;
  case '\a':
    if (uVar21 == 0x120) {
      bVar7 = piday();
      if (bVar7 == '\0') goto LAB_001ffa50;
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"irration",8);
      *(undefined8 *)(lVar9 + 0x32f837 + sVar10) = 0x656970206c616e;
    }
    else if (uVar2 == 0x11e) {
      if (ffruit != (fruit *)0x0) {
        pfVar26 = ffruit;
        do {
          iVar8 = pfVar26->fid;
          iVar18 = -iVar8;
          if (0 < iVar8) {
            iVar18 = iVar8;
          }
          if (iVar18 == obj->spe) goto LAB_001ff4c4;
          pfVar26 = pfVar26->nextf;
        } while (pfVar26 != (fruit *)0x0);
      }
      warning("Bad fruit #%d?",(ulong)(uint)(int)obj->spe);
    }
    else {
LAB_001ffa50:
      strcat(__s,__src->fname);
      if ((uVar21 == 0x129) && (bVar25 != 0)) {
        if (obj->spe < '\x01') {
          uVar4 = obj->corpsenm;
          if ((long)(int)uVar4 != -1) {
            bVar24 = mons[(int)uVar4].mlet;
            if (bVar24 < 0x1f) {
              if (bVar24 < 0x16) {
                if ((bVar24 != 2) && (bVar24 != 10)) {
LAB_00200470:
                  pcVar12 = eos(__s);
                  pcVar14 = mons_mname(mons + obj->corpsenm);
                  pcVar23 = " of %s meat";
                  goto LAB_00200274;
                }
              }
              else if ((bVar24 != 0x16) && (bVar24 != 0x19)) goto LAB_00200470;
            }
            else if (bVar24 < 0x2a) {
              if (bVar24 == 0x1f) {
                if (uVar4 == 0x9e) goto LAB_0020006c;
              }
              else if (bVar24 != 0x20) goto LAB_00200470;
            }
            else {
LAB_0020006c:
              if (bVar24 == 0x2a) {
                if (uVar4 == 0xd6) goto LAB_00200470;
              }
              else if ((bVar24 != 0x36) && ((bVar24 != 0x37 || ((uVar4 | 2) == 0x106))))
              goto LAB_00200470;
            }
            pcVar12 = eos(__s);
            pcVar14 = mons_mname(mons + obj->corpsenm);
            pcVar23 = " of %s";
            goto LAB_00200274;
          }
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"empty ti",8);
          *(undefined2 *)(lVar9 + 0x32f838 + sVar10) = 0x6e;
        }
        else {
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," of spin",8);
          *(undefined4 *)(lVar9 + 0x32f838 + sVar10) = 0x686361;
        }
      }
    }
    break;
  case '\b':
    if ((bVar16 != 0) && ((obj->field_0x4b & 3) != 0)) {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"diluted ",8);
      *(undefined1 *)(lVar9 + 0x32f838 + sVar10) = 0;
    }
    if (((bVar27 == false) && ((fruit *)pcVar14 == (fruit *)0x0)) && (bVar16 != 0)) {
      if (((obj->field_0x4b & 0x20) == 0) || ((ushort)(obj->otyp - 0xdaU) < 3)) {
        strcat(__s,(char *)__src_00);
        sVar10 = strlen(__s);
        (__s + sVar10)[0] = ' ';
        (__s + sVar10)[1] = '\0';
      }
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"poti",4);
      *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x6e6f69;
    }
    else {
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"poti",4);
      *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x6e6f69;
      if (bVar16 != 0) {
        sVar10 = strlen(__s);
        if (bVar27 == false) {
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," called ",9);
        }
        else {
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," of ",5);
          pfVar26 = __src;
          if (((uVar21 == 0x14f) && (sVar3 == 0x161 || (char)((uVar4 & 0x40) >> 6) != '\0')) &&
             ((*(uint *)&obj->field_0x4a & 3) != 0)) {
            pcVar14 = "holy ";
            if ((*(uint *)&obj->field_0x4a & 2) == 0) {
              pcVar14 = "unholy ";
            }
            strcat(__s,pcVar14);
          }
        }
        goto LAB_001ff4c4;
      }
    }
    break;
  case '\t':
    if (bVar16 != 0) {
      if (bVar27 == false) {
        if ((fruit *)pcVar14 == (fruit *)0x0) {
          if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU)))
          goto LAB_0020000d;
          if ((poVar1->field_0x10 & 0x10) == 0) {
            strcat(__s,(char *)__src_00);
            sVar10 = strlen(__s);
            builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," scroll",8);
            break;
          }
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"scroll labeled ",0x10);
          pfVar26 = __src_00;
        }
        else {
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"scroll c",8);
          *(undefined8 *)(lVar9 + 0x32f837 + sVar10) = 0x2064656c6c6163;
        }
      }
      else {
        sVar10 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"scroll o",8);
        *(undefined4 *)(lVar9 + 0x32f837 + sVar10) = 0x20666f;
        pfVar26 = __src;
      }
      goto LAB_001ff4c4;
    }
LAB_0020000d:
    sVar10 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"scro",4);
    *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x6c6c6f;
    break;
  case '\n':
    if (bVar16 != 0) {
      if (bVar27 != false) {
        pfVar26 = __src;
        if (uVar21 != 0x1bd) {
          sVar10 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"spellboo",8);
          *(undefined8 *)(lVar9 + 0x32f836 + sVar10) = 0x20666f206b6f6f;
        }
        goto LAB_001ff4c4;
      }
      if ((fruit *)pcVar14 == (fruit *)0x0) {
        if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU))) goto LAB_001ff99f;
        pcVar12 = eos(__s);
        pcVar23 = "%s spellbook";
        pcVar14 = (char *)__src_00;
      }
      else {
        pcVar12 = eos(__s);
        pcVar23 = "spellbook called %s";
      }
      goto LAB_00200274;
    }
LAB_001ff99f:
    sVar10 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"spellboo",8);
    *(undefined2 *)(lVar9 + 0x32f838 + sVar10) = 0x6b;
    break;
  case '\v':
    if (bVar16 == 0) {
LAB_001ff9f6:
      sVar10 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50,"wand",4);
      goto LAB_001ffa07;
    }
    if (bVar27 == false) {
      if ((fruit *)pcVar14 == (fruit *)0x0) {
        if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU))) goto LAB_001ff9f6;
        pcVar12 = eos(__s);
        pcVar23 = "%s wand";
        pcVar14 = (char *)__src_00;
      }
      else {
        pcVar12 = eos(__s);
        pcVar23 = "wand called %s";
      }
    }
    else {
      pcVar12 = eos(__s);
      pcVar23 = "wand of %s";
      pcVar14 = __src->fname;
    }
    goto LAB_00200274;
  case '\f':
  case '\x10':
switchD_001ff351_caseD_c:
    pfVar26 = __src;
LAB_001ff4c4:
    strcat(__s,pfVar26->fname);
    break;
  case '\r':
    pfVar26 = (fruit *)0x2a8632;
    if ((*(ushort *)&poVar1->field_0x11 & 0x1f0) == 0x150) {
      pfVar26 = (fruit *)0x29f200;
    }
    if (bVar16 == 0) goto LAB_001ff4c4;
    if (bVar27 != false) {
      strcat(__s,__src->fname);
      if ((uVar21 == 0x212) ||
         (((*(ushort *)&poVar6[uVar22].field_0x11 & 0x1f0) == 0x140 &&
          ((0xd < uVar2 - 0x1f0 || ((0x2077U >> (uVar2 - 0x1f0 & 0x1f) & 1) == 0)))))) {
        sVar10 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," sto",4);
        *(undefined4 *)(lVar9 + 0x32f833 + sVar10) = 0x656e6f;
      }
      break;
    }
    if ((fruit *)pcVar14 == (fruit *)0x0) {
      if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU))) goto LAB_001ff4c4;
      pcVar12 = eos(__s);
      pcVar23 = "%s %s";
      pcVar14 = pfVar26->fname;
    }
    else {
      pcVar12 = eos(__s);
      pcVar23 = "%s called %s";
      __src_00 = pfVar26;
    }
    goto LAB_001ffde0;
  case '\x0e':
    if (uVar21 != 0x215) goto switchD_001ff351_caseD_c;
    pcVar14 = eos(__s);
    pcVar12 = "";
    pcVar23 = "";
    if ((urole.malenum == 0x159) && (pcVar23 = "historic ", (obj->spe & 1U) == 0)) {
      pcVar23 = "";
    }
    iVar8 = obj->corpsenm;
    if ((mons[iVar8].mflags2 & 0x80000) == 0) {
      if ((mons[iVar8].geno & 0x1000) == 0) {
        pcVar12 = mons_mname(mons + iVar8);
        pcVar11 = strchr("aeiouAEIOU",(int)*pcVar12);
        pcVar12 = "an ";
        if (pcVar11 == (char *)0x0) {
          pcVar12 = "a ";
        }
      }
      else {
        pcVar12 = "the ";
      }
    }
    pcVar11 = mons_mname(mons + obj->corpsenm);
    sprintf(pcVar14,"%s%s of %s%s",pcVar23,__src,pcVar12,pcVar11);
    break;
  case '\x0f':
    pcVar12 = eos(__s);
    pcVar14 = "";
    if ((uint)poVar1->oc_weight < obj->owt) {
      pcVar14 = "very ";
    }
    pcVar23 = "%sheavy iron ball";
LAB_00200274:
    sprintf(pcVar12,pcVar23,pcVar14);
    break;
  default:
    sprintf(__s,"glorkum %d %d %d",(ulong)(uint)(int)obj->oclass,uVar22 & 0xffffffff,
            (ulong)(uint)(int)obj->spe);
  }
  if ((ignore_oquan == '\0') && (obj->quan != 1)) {
    pcVar14 = makeplural(__s);
    strcpy(__s,pcVar14);
  }
  if ((obj->onamelth != '\0') && (bVar16 != 0)) {
    sVar10 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar10 + lVar9 + 0x50," named ",8);
LAB_002002cb:
    strcat(__s,(char *)((long)obj->oextra + (long)obj->oxlth));
  }
  iVar8 = strncasecmp(__s,"the ",4);
  pcVar14 = nextobuf_bufs + lVar9 + 0x54;
  if (iVar8 != 0) {
    pcVar14 = __s;
  }
  return pcVar14;
}

Assistant:

static char *xname2(const struct obj *obj, boolean ignore_oquan)
{
	char *buf;
	int typ = obj->otyp;
	struct objclass *ocl = &objects[typ];
	int nn = ocl->oc_name_known ||
		 /* only reveal level prizes when in sight */
		 (Is_prize(obj) &&
		  (cansee(obj->ox, obj->oy) ||
		   /* even reveal when Sokoban prize only felt */
		   (u.ux == obj->ox && u.uy == obj->oy)));
	const char *actualn = OBJ_NAME(*ocl);
	const char *dn = OBJ_DESCR(*ocl);
	const char *un = ocl->oc_uname;
	boolean known = obj->known;
	boolean dknown = obj->dknown;
	boolean bknown = obj->bknown;
	boolean dump_ID_flag = program_state.gameover;

	buf = nextobuf() + PREFIX;	/* leave room for "17 -3 " */
	if (Role_if (PM_SAMURAI) && Japanese_item_name(typ))
		actualn = Japanese_item_name(typ);

	buf[0] = '\0';
	
	/*
	 * clean up known when it's tied to oc_name_known, eg after AD_DRIN
	 * This is only required for unique objects since the article
	 * printed for the object is tied to the combination of the two
	 * and printing the wrong article gives away information.
	 */
	if (!nn && ocl->oc_uses_known && ocl->oc_unique) known = 0;
	if (!Blind) dknown = TRUE;
	/* needed, otherwise BoH only shows up as "bag" when blind */
	if (Is_prize(obj)) dknown = TRUE;
	if (Role_if (PM_PRIEST)) bknown = TRUE;
	if (obj_is_pname(obj))
	    goto nameit;

	/*
	 * Give "magical" prefix to objects with properties as long as not all of
	 * them are known.
	 */
	if ((obj->oprops_known & ITEM_MAGICAL) && !dump_ID_flag &&
	    (obj->oprops & ~obj->oprops_known))
	    strcat(buf, "magical ");

	/* prizes suppress description of objects detected/remembered from afar */
	if (Is_prize(obj) && !un)
	    strcat(buf, "prize ");

	switch (obj->oclass) {
	    case AMULET_CLASS:
		if (!dknown) {
		    strcat(buf, "amulet");
		} else {
		    if (typ == AMULET_OF_YENDOR ||
			typ == FAKE_AMULET_OF_YENDOR)
			/* each must be identified individually */
			strcat(buf, known ? actualn : dn);
		    else if (nn)
			strcat(buf, actualn);
		    else if (un || Is_prize(obj))
			strcat(buf, "amulet"); /* u-named after props */
		    else
			sprintf(eos(buf), "%s amulet", dn);

		    propnames(buf, obj->oprops, obj->oprops_known, FALSE,
			      !!strstr(buf, " of "));

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		break;
	    case WEAPON_CLASS:
		if (is_poisonable(obj) && obj->opoisoned)
		    strcat(buf, "poisoned ");
		/* fall through */
	    case VENOM_CLASS:
	    case TOOL_CLASS:
		if (typ == LENSES)
		    strcat(buf, "pair of ");

		if (!dknown) {
		    strcat(buf, dn ? dn : actualn);
		} else {
		    if ((obj->oprops & ITEM_DRLI) &&
			((obj->oprops_known & ITEM_DRLI) || dump_ID_flag)) {
			if (obj->oprops_known & ITEM_DRLI)
			    strcat(buf, "thirsty ");
			else
			    strcat(buf, "[thirsty] ");
		    }
		    if ((obj->oprops & ITEM_VORPAL) &&
			((obj->oprops_known & ITEM_VORPAL) || dump_ID_flag)) {
			if (obj->oprops_known & ITEM_VORPAL)
			    strcat(buf, "vorpal ");
			else
			    strcat(buf, "[vorpal] ");
		    }

		    if (nn)
			strcat(buf, actualn);
		    else if (un)
			strcat(buf, dn ? dn : actualn); /* u-named after props */
		    else if (Is_prize(obj) && obj->oclass != WEAPON_CLASS)
			strcat(buf, "tool");
		    else
			strcat(buf, dn ? dn : actualn);

		    /* avoid "pair of lenses and fire" */
		    propnames(buf, obj->oprops, obj->oprops_known, TRUE,
			      !!strstr((typ == LENSES ?
					    strstr(buf, "pair of ") + 8 :
					    buf), " of "));

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		/* If we use an() here we'd have to remember never to use */
		/* it whenever calling doname() or xname(). */
		if (typ == FIGURINE)
		    sprintf(eos(buf), " of a%s %s",
			strchr(vowels,*(mons_mname(&mons[obj->corpsenm]))) ? "n" : "",
			mons_mname(&mons[obj->corpsenm]));
		break;
	    case ARMOR_CLASS:
		if (Is_dragon_scales(typ)) strcat(buf, "set of ");
		if (is_boots(obj) || is_gloves(obj)) strcat(buf, "pair of ");

		if (dknown && (obj->oprops & ITEM_OILSKIN) &&
		    ((obj->oprops_known & ITEM_OILSKIN) || dump_ID_flag)) {
		    if (obj->oprops_known & ITEM_OILSKIN)
			strcat(buf, "oilskin ");
		    else
			strcat(buf, "[oilskin] ");
		}

		if (obj->otyp >= ELVEN_SHIELD && obj->otyp <= ORCISH_SHIELD
				&& !dknown) {
			strcpy(buf, "shield");
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  FALSE);
			break;
		}
		if (obj->otyp == SHIELD_OF_REFLECTION && !dknown) {
			strcpy(buf, "smooth shield");
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  FALSE);
			break;
		}

		if (nn) {
			strcat(buf, actualn);
			/* allow "pair of boots of fire resistance" */
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  !!strstr(actualn, " of "));
		} else if (un || Is_prize(obj)) {
			if (is_boots(obj))
				strcat(buf,"boots");
			else if (is_gloves(obj))
				strcat(buf,"gloves");
			else if (is_cloak(obj))
				strcat(buf,"cloak");
			else if (is_helmet(obj))
				strcat(buf,"helmet");
			else if (is_shield(obj))
				strcat(buf,"shield");
			else
				strcat(buf,"armor");
			if (un) {
				propnames(buf, obj->oprops, obj->oprops_known, FALSE,
					  FALSE);
				strcat(buf, " called ");
				strcat(buf, un);
			}
		} else {
			strcat(buf, dn);
			/* skip "set of"/"pair of" for proper wording of
			 * "set of draken scales of fire resistance" */
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  !!strstr((Is_dragon_scales(typ) ?
						strstr(buf, "set of ") + 7:
					    (is_boots(obj) || is_gloves(obj)) ?
						strstr(buf, "pair of ") + 8:
						buf), " of "));
		}
		break;
	    case FOOD_CLASS:
		if (typ == SLIME_MOLD) {
			struct fruit *f;

			for (f=ffruit; f; f = f->nextf) {
				/* Object naming may occur due to bones trimming,
				 * where fids may be negative. */
				if (abs(f->fid) == obj->spe) {
					strcat(buf, f->fname);
					break;
				}
			}
			if (!f) warning("Bad fruit #%d?", obj->spe);
			break;
		} else if (typ == CREAM_PIE && piday()) {
			strcat(buf, "irrational pie");
			break;
		}

		strcat(buf, actualn);
		if (typ == TIN && known) {
		    if (obj->spe > 0)
			strcat(buf, " of spinach");
		    else if (obj->corpsenm == NON_PM)
		        strcat(buf, "empty tin");
		    else if (vegetarian(&mons[obj->corpsenm]))
			sprintf(eos(buf), " of %s", mons_mname(&mons[obj->corpsenm]));
		    else
			sprintf(eos(buf), " of %s meat", mons_mname(&mons[obj->corpsenm]));
		}
		break;
	    case COIN_CLASS:
	    case CHAIN_CLASS:
		strcat(buf, actualn);
		break;
	    case ROCK_CLASS:
		if (typ == STATUE)
		    sprintf(eos(buf), "%s%s of %s%s",
			(Role_if (PM_ARCHEOLOGIST) && (obj->spe & STATUE_HISTORIC)) ? "historic " : "" ,
			actualn,
			type_is_pname(&mons[obj->corpsenm]) ? "" :
			  (mons[obj->corpsenm].geno & G_UNIQ) ? "the " :
			    (strchr(vowels,*(mons_mname(&mons[obj->corpsenm]))) ?
								"an " : "a "),
			mons_mname(&mons[obj->corpsenm]));
		else strcat(buf, actualn);
		break;
	    case BALL_CLASS:
		sprintf(eos(buf), "%sheavy iron ball",
			(obj->owt > ocl->oc_weight) ? "very " : "");
		break;
	    case POTION_CLASS:
		if (dknown && obj->odiluted)
			strcat(buf, "diluted ");
		if (nn || un || !dknown) {
			strcat(buf, "potion");
			if (!dknown) break;
			if (nn) {
			    strcat(buf, " of ");
			    if (typ == POT_WATER &&
				bknown && (obj->blessed || obj->cursed)) {
				strcat(buf, obj->blessed ? "holy " : "unholy ");
			    }
			    strcat(buf, actualn);
			} else {
				strcat(buf, " called ");
				strcat(buf, un);
			}
		} else {
			if (!Is_prize(obj)) {
			    strcat(buf, dn);
			    strcat(buf, " ");
			}
			strcat(buf, "potion");
		}
		break;
	case SCROLL_CLASS:
		if (!dknown) {
		    strcat(buf, "scroll");
		    break;
		}
		if (nn) {
			strcat(buf, "scroll of ");
			strcat(buf, actualn);
		} else if (un) {
			strcat(buf, "scroll called ");
			strcat(buf, un);
		} else if (Is_prize(obj)) {
			strcat(buf, "scroll");
		} else if (ocl->oc_magic) {
			strcat(buf, "scroll labeled ");
			strcat(buf, dn);
		} else {
			strcat(buf, dn);
			strcat(buf, " scroll");
		}
		break;
	case WAND_CLASS:
		if (!dknown)
			strcat(buf, "wand");
		else if (nn)
			sprintf(eos(buf), "wand of %s", actualn);
		else if (un)
			sprintf(eos(buf), "wand called %s", un);
		else if (Is_prize(obj))
			strcat(buf, "wand");
		else
			sprintf(eos(buf), "%s wand", dn);
		break;
	case SPBOOK_CLASS:
		if (!dknown) {
			strcat(buf, "spellbook");
		} else if (nn) {
			if (typ != SPE_BOOK_OF_THE_DEAD)
			    strcat(buf, "spellbook of ");
			strcat(buf, actualn);
		} else if (un) {
			sprintf(eos(buf), "spellbook called %s", un);
		} else if (Is_prize(obj)) {
			strcat(buf, "spellbook");
		} else {
			sprintf(eos(buf), "%s spellbook", dn);
		}
		break;
	case RING_CLASS:
		if (!dknown) {
		    strcat(buf, "ring");
		} else {
		    if (nn)
			sprintf(eos(buf), "ring of %s", actualn);
		    else if (un)
			strcat(buf, "ring"); /* u-named after props */
		    else if (Is_prize(obj))
			strcat(buf, "ring");
		    else
			sprintf(eos(buf), "%s ring", dn);

		    propnames(buf, obj->oprops, obj->oprops_known, FALSE, nn);

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		break;
	case GEM_CLASS:
	    {
		const char *rock =
			    (ocl->oc_material == MINERAL) ? "stone" : "gem";
		if (!dknown) {
		    strcat(buf, rock);
		} else if (!nn) {
		    if (un) sprintf(eos(buf), "%s called %s", rock, un);
		    else if (Is_prize(obj)) strcat(buf, rock);
		    else sprintf(eos(buf), "%s %s", dn, rock);
		} else {
		    strcat(buf, actualn);
		    if (GemStone(typ)) strcat(buf, " stone");
		}
		break;
	    }
	default:
		sprintf(buf,"glorkum %d %d %d", obj->oclass, typ, obj->spe);
	}
	if (!ignore_oquan && obj->quan != 1L) strcpy(buf, makeplural(buf));

	if (obj->onamelth && dknown) {
		strcat(buf, " named ");
nameit:
		strcat(buf, ONAME(obj));
	}

	if (!strncmpi(buf, "the ", 4)) buf += 4;
	return buf;
}